

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# repeat_end_matcher.hpp
# Opt level: O1

bool __thiscall
boost::xpressive::detail::repeat_end_matcher<mpl_::bool_<true>>::
match<__gnu_cxx::__normal_iterator<char_const*,std::__cxx11::string>,boost::xpressive::detail::matchable_ex<__gnu_cxx::__normal_iterator<char_const*,std::__cxx11::string>>>
          (repeat_end_matcher<mpl_::bool_<true>> *this,
          match_state<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          *state,matchable_ex<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 *next)

{
  bool bVar1;
  sub_match_impl *psVar2;
  bool bVar3;
  int iVar4;
  
  iVar4 = *(int *)this;
  psVar2 = state->sub_matches_;
  bVar1 = psVar2[iVar4].zero_width_;
  if ((bVar1 == true) && (psVar2[iVar4].begin_._M_current == (state->cur_)._M_current)) {
    iVar4 = (*(next->
              super_matchable<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              )._vptr_matchable[2])(next);
    return SUB41(iVar4,0);
  }
  psVar2[iVar4].zero_width_ = psVar2[iVar4].begin_._M_current == (state->cur_)._M_current;
  bVar3 = match_<__gnu_cxx::__normal_iterator<char_const*,std::__cxx11::string>,boost::xpressive::detail::matchable_ex<__gnu_cxx::__normal_iterator<char_const*,std::__cxx11::string>>>
                    ();
  if (!bVar3) {
    psVar2[iVar4].zero_width_ = bVar1;
  }
  return bVar3;
}

Assistant:

bool match(match_state<BidiIter> &state, Next const &next) const
        {
            // prevent repeated zero-width sub-matches from causing infinite recursion
            sub_match_impl<BidiIter> &br = state.sub_match(this->mark_number_);

            if(br.zero_width_ && br.begin_ == state.cur_)
            {
                return next.skip_match(state);
            }

            bool old_zero_width = br.zero_width_;
            br.zero_width_ = (br.begin_ == state.cur_);

            if(this->match_(state, next, greedy_type()))
            {
                return true;
            }

            br.zero_width_ = old_zero_width;
            return false;
        }